

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

void __thiscall
cmELFInternal::cmELFInternal
          (cmELFInternal *this,cmELF *external,
          unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          *fin,ByteOrderType order)

{
  _Rb_tree_header *p_Var1;
  basic_ifstream<char,_std::char_traits<char>_> *pbVar2;
  
  this->_vptr_cmELFInternal = (_func_int **)&PTR__cmELFInternal_0058b4d0;
  this->External = external;
  pbVar2 = (fin->_M_t).
           super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  (fin->_M_t).
  super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_ifstream<char,_std::char_traits<char>_> *)0x0;
  this->Stream = (istream *)pbVar2;
  this->ByteOrder = order;
  this->ELFType = FileTypeInvalid;
  p_Var1 = &(this->DynamicSectionStrings)._M_t._M_impl.super__Rb_tree_header;
  (this->DynamicSectionStrings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DynamicSectionStrings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DynamicSectionStrings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DynamicSectionStrings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DynamicSectionStrings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->NeedSwap = order == ByteOrderMSB;
  this->DynamicSectionIndex = -1;
  return;
}

Assistant:

cmELFInternal(cmELF* external, std::unique_ptr<cmsys::ifstream>& fin,
                ByteOrderType order)
    : External(external)
    , Stream(*fin.release())
    , ByteOrder(order)
    , ELFType(cmELF::FileTypeInvalid)
  {
// In most cases the processor-specific byte order will match that
// of the target execution environment.  If we choose wrong here
// it is fixed when the header is read.
#if KWIML_ABI_ENDIAN_ID == KWIML_ABI_ENDIAN_ID_LITTLE
    this->NeedSwap = (this->ByteOrder == ByteOrderMSB);
#elif KWIML_ABI_ENDIAN_ID == KWIML_ABI_ENDIAN_ID_BIG
    this->NeedSwap = (this->ByteOrder == ByteOrderLSB);
#else
    this->NeedSwap = false; // Final decision is at runtime anyway.
#endif

    // We have not yet loaded the section info.
    this->DynamicSectionIndex = -1;
  }